

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O3

Chunk * __thiscall Mempool::alloc_chunk(Mempool *this,int n)

{
  Chunk *pCVar1;
  int iVar2;
  uint uVar3;
  mapped_type *ppCVar4;
  mapped_type this_00;
  uint uVar5;
  undefined8 uVar6;
  char *__format;
  bool bVar7;
  uint local_24;
  
  local_24 = 0x1000;
  while ((int)local_24 < n) {
    bVar7 = 0x100000 < local_24;
    local_24 = local_24 * 4;
    if (bVar7) {
      return (Chunk *)0x0;
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mp_mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  ppCVar4 = std::__detail::
            _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,(key_type *)&local_24);
  uVar5 = local_24;
  if (*ppCVar4 != (mapped_type)0x0) {
    ppCVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_24);
    this_00 = *ppCVar4;
    pCVar1 = this_00->next;
    ppCVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,(key_type *)&local_24);
    *ppCVar4 = pCVar1;
    this_00->next = (Chunk *)0x0;
    uVar5 = local_24 + 0x3ff;
    if (-1 < (int)local_24) {
      uVar5 = local_24;
    }
    this->mp_left_size_kb = this->mp_left_size_kb - (long)((int)uVar5 >> 10);
LAB_001053e8:
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return this_00;
  }
  uVar3 = local_24 + 0x3ff;
  if (-1 < (int)local_24) {
    uVar3 = local_24;
  }
  if ((long)((int)uVar3 >> 10) + this->mp_total_size_kb < 0x400000) {
    this_00 = (mapped_type)operator_new(0x20,(nothrow_t *)&std::nothrow);
    if (this_00 != (Chunk *)0x0) {
      Chunk::Chunk(this_00,uVar5);
      uVar5 = local_24 + 0x3ff;
      if (-1 < (int)local_24) {
        uVar5 = local_24;
      }
      this->mp_total_size_kb = this->mp_total_size_kb + (long)((int)uVar5 >> 10);
      goto LAB_001053e8;
    }
    if (pr_level < 0) goto LAB_0010545b;
    __format = "[%-5s][%s:%d] new chunk error\n";
    uVar6 = 0x41;
  }
  else {
    if (pr_level < 0) goto LAB_0010545b;
    __format = "[%-5s][%s:%d] beyond the limit size of memory!\n";
    uVar6 = 0x3b;
  }
  printf(__format,"error","alloc_chunk",uVar6);
LAB_0010545b:
  exit(1);
}

Assistant:

Chunk *Mempool::alloc_chunk(int n) 
{
    int index;
    bool found = false;
    for(index = mLow; index <= mUp; index = index * MEM_CAP_MULTI_POWER)
    {
        if(n <= index)
        {
            found = true;
            break;
        }
    }

    if(!found)
    {
        return nullptr;
    }

    lock_guard<mutex> lck(mp_mutex);
    if (mp_pool[index] == nullptr) {
        if (mp_total_size_kb + index/1024 >= MAX_POOL_SIZE) {
            PR_ERROR("beyond the limit size of memory!\n");
            exit(1);
        }

        Chunk *new_buf = new (std::nothrow) Chunk(index);
        if (new_buf == nullptr) {
            PR_ERROR("new chunk error\n");
            exit(1);
        }
        mp_total_size_kb += index/1024;
        return new_buf;
    }

    Chunk *target = mp_pool[index];
    mp_pool[index] = target->next;
    target->next = nullptr;
    mp_left_size_kb -= index/1024;

    return target;
}